

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testLineAlgo.cpp
# Opt level: O2

void anon_unknown.dwarf_8eef6::testIntersect
               (Line3f *line,V3f *v0,V3f *v1,V3f *v2,V3f *point,bool front,bool returnValue)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  bool bVar7;
  bool fr;
  V3f bary;
  V3f pt;
  bool local_59;
  Vec3<float> local_58;
  Vec3<float> local_4c;
  Vec3<float> local_40;
  
  bVar7 = Imath_3_2::intersect<float>(line,v0,v1,v2,&local_4c,&local_58,&local_59);
  if (bVar7 != returnValue) {
    __assert_fail("rv == returnValue",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testLineAlgo.cpp"
                  ,0x9d,
                  "void (anonymous namespace)::testIntersect(const Line3f &, const V3f &, const V3f &, const V3f &, const V3f &, bool, bool)"
                 );
  }
  if (bVar7) {
    if (local_59 != front) {
      __assert_fail("front == fr",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testLineAlgo.cpp"
                    ,0xa3,
                    "void (anonymous namespace)::testIntersect(const Line3f &, const V3f &, const V3f &, const V3f &, const V3f &, bool, bool)"
                   );
    }
    bVar7 = Imath_3_2::Vec3<float>::equalWithAbsError(&local_4c,point,1.1920929e-06);
    if (!bVar7) {
      __assert_fail("pt.equalWithAbsError (point, e)",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testLineAlgo.cpp"
                    ,0xa4,
                    "void (anonymous namespace)::testIntersect(const Line3f &, const V3f &, const V3f &, const V3f &, const V3f &, bool, bool)"
                   );
    }
    local_40.z = v2->z * local_58.z + v1->z * local_58.y + v0->z * local_58.x;
    uVar1 = v0->x;
    uVar4 = v0->y;
    uVar2 = v1->x;
    uVar5 = v1->y;
    uVar3 = v2->x;
    uVar6 = v2->y;
    local_40.y = local_58.z * (float)uVar6 + local_58.y * (float)uVar5 + local_58.x * (float)uVar4;
    local_40.x = local_58.z * (float)uVar3 + local_58.y * (float)uVar2 + local_58.x * (float)uVar1;
    bVar7 = Imath_3_2::Vec3<float>::equalWithAbsError(&local_4c,&local_40,1.1920929e-06);
    if (!bVar7) {
      __assert_fail("pt.equalWithAbsError (pt2, e)",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testLineAlgo.cpp"
                    ,0xa6,
                    "void (anonymous namespace)::testIntersect(const Line3f &, const V3f &, const V3f &, const V3f &, const V3f &, bool, bool)"
                   );
    }
  }
  return;
}

Assistant:

void
testIntersect (
    const Line3f& line,
    const V3f&    v0,
    const V3f&    v1,
    const V3f&    v2,
    const V3f&    point,
    bool          front,
    bool          returnValue)
{
    V3f  pt;
    V3f  bary;
    bool fr;

    bool rv = intersect (line, v0, v1, v2, pt, bary, fr);

    assert (rv == returnValue);

    float e = 10 * std::numeric_limits<float>::epsilon ();

    if (rv)
    {
        assert (front == fr);
        assert (pt.equalWithAbsError (point, e));
        V3f pt2 = v0 * bary.x + v1 * bary.y + v2 * bary.z;
        assert (pt.equalWithAbsError (pt2, e));
    }
}